

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                  *this,dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                        *ht,size_type min_buckets_wanted)

{
  float fVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  bool bVar5;
  size_type sVar6;
  size_type sVar7;
  size_type min_buckets_wanted_local;
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *ht_local;
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *this_local;
  
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  enlarge_threshold_ =
       (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       enlarge_threshold_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  shrink_threshold_ =
       (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       shrink_threshold_;
  fVar1 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          shrink_factor_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  shrink_factor_ = fVar1;
  bVar5 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          use_empty_;
  bVar2 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          use_deleted_;
  uVar3 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          field_0x1b;
  uVar4 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  consider_shrink_ =
       (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       consider_shrink_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_empty_ =
       bVar5;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_deleted_
       = bVar2;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.field_0x1b =
       uVar3;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  num_ht_copies_ = uVar4;
  (this->key_info).delkey = (ht->key_info).delkey;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  ValInfo::ValInfo(&this->val_info,&ht->val_info);
  this->table = (pointer)0x0;
  bVar5 = sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
          use_empty((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)ht);
  if (bVar5) {
    sVar6 = bucket_count(this);
    sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)this,sVar6);
    copy_from(this,ht,min_buckets_wanted);
  }
  else {
    bVar5 = empty(ht);
    if (!bVar5) {
      __assert_fail("ht.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                    ,0x2d3,
                    "google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::dense_hashtable(const dense_hashtable<Value, Key, HashFcn, ExtractKey, SetKey, EqualKey, Alloc> &, size_type) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                   );
    }
    sVar6 = size(ht);
    sVar7 = sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)this,sVar6
                        ,min_buckets_wanted);
    this->num_buckets = sVar7;
    sVar6 = bucket_count(this);
    sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)this,sVar6);
  }
  return;
}

Assistant:

dense_hashtable(const dense_hashtable& ht,
                  size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(ht.val_info),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_from(ht, min_buckets_wanted);   // copy_from() ignores deleted entries
  }